

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(char16_t *s,ostream *os)

{
  ostream *in_RDI;
  char16_t *unaff_retaddr;
  
  anon_unknown_37::PrintCStringTo<char16_t>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void PrintTo(const char16_t* s, ostream* os) { PrintCStringTo(s, os); }